

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void translateColumnToCopy(Parse *pParse,int iStart,int iTabCur,int iRegister,int bIncrRowid)

{
  Vdbe *p;
  int iVar1;
  VdbeOp *pVStack_30;
  int iEnd;
  VdbeOp *pOp;
  Vdbe *v;
  int bIncrRowid_local;
  int iRegister_local;
  int iTabCur_local;
  int iStart_local;
  Parse *pParse_local;
  
  p = pParse->pVdbe;
  pVStack_30 = sqlite3VdbeGetOp(p,iStart);
  iVar1 = sqlite3VdbeCurrentAddr(p);
  iRegister_local = iStart;
  if (pParse->db->mallocFailed == '\0') {
    for (; iRegister_local < iVar1; iRegister_local = iRegister_local + 1) {
      if (pVStack_30->p1 == iTabCur) {
        if (pVStack_30->opcode == 'Z') {
          pVStack_30->opcode = 'N';
          pVStack_30->p1 = pVStack_30->p2 + iRegister;
          pVStack_30->p2 = pVStack_30->p3;
          pVStack_30->p3 = 0;
        }
        else if (pVStack_30->opcode == 0x80) {
          if (bIncrRowid == 0) {
            pVStack_30->opcode = 'I';
            pVStack_30->p1 = 0;
            pVStack_30->p3 = 0;
          }
          else {
            pVStack_30->opcode = 'S';
            pVStack_30->p1 = pVStack_30->p2;
            pVStack_30->p2 = 1;
          }
        }
      }
      pVStack_30 = pVStack_30 + 1;
    }
  }
  return;
}

Assistant:

static void translateColumnToCopy(
  Parse *pParse,      /* Parsing context */
  int iStart,         /* Translate from this opcode to the end */
  int iTabCur,        /* OP_Column/OP_Rowid references to this table */
  int iRegister,      /* The first column is in this register */
  int bIncrRowid      /* If non-zero, transform OP_rowid to OP_AddImm(1) */
){
  Vdbe *v = pParse->pVdbe;
  VdbeOp *pOp = sqlite3VdbeGetOp(v, iStart);
  int iEnd = sqlite3VdbeCurrentAddr(v);
  if( pParse->db->mallocFailed ) return;
  for(; iStart<iEnd; iStart++, pOp++){
    if( pOp->p1!=iTabCur ) continue;
    if( pOp->opcode==OP_Column ){
      pOp->opcode = OP_Copy;
      pOp->p1 = pOp->p2 + iRegister;
      pOp->p2 = pOp->p3;
      pOp->p3 = 0;
    }else if( pOp->opcode==OP_Rowid ){
      if( bIncrRowid ){
        /* Increment the value stored in the P2 operand of the OP_Rowid. */
        pOp->opcode = OP_AddImm;
        pOp->p1 = pOp->p2;
        pOp->p2 = 1;
      }else{
        pOp->opcode = OP_Null;
        pOp->p1 = 0;
        pOp->p3 = 0;
      }
    }
  }
}